

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

string * __thiscall
slang::ast::GenerateBlockSymbol::getExternalName_abi_cxx11_
          (string *__return_storage_ptr__,GenerateBlockSymbol *this)

{
  size_t sVar1;
  char *pcVar2;
  Scope *in_RCX;
  
  sVar1 = (this->super_Symbol).name._M_len;
  if (sVar1 == 0) {
    createGenBlkName_abi_cxx11_
              (__return_storage_ptr__,(ast *)(ulong)this->constructIndex,
               (uint32_t)(this->super_Symbol).parentScope,in_RCX);
  }
  else {
    pcVar2 = (this->super_Symbol).name._M_str;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateBlockSymbol::getExternalName() const {
    if (!name.empty())
        return std::string(name);

    auto parent = getParentScope();
    SLANG_ASSERT(parent);

    return createGenBlkName(constructIndex, *parent);
}